

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

void __thiscall pbrt::NanoVDBBuffer::clear(NanoVDBBuffer *this)

{
  memory_resource *pmVar1;
  NanoVDBBuffer *local_18;
  
  if (LOGGING_LogLevel < 1) {
    local_18 = this;
    Log<pbrt::NanoVDBBuffer*,unsigned_char*&,unsigned_long&>
              (Verbose,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media.h"
               ,0x21b,"this %p clear ptr %p bytes %d",&local_18,&this->ptr,&this->bytesAllocated);
  }
  if (this->ptr != (uint8_t *)0x0) {
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->bytesAllocated,0x80);
  }
  this->bytesAllocated = 0;
  this->ptr = (uint8_t *)0x0;
  return;
}

Assistant:

void clear() {
        LOG_VERBOSE("this %p clear ptr %p bytes %d", this, ptr, bytesAllocated);
        alloc.deallocate_bytes(ptr, bytesAllocated, 128);
        bytesAllocated = 0;
        ptr = nullptr;
    }